

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check.h
# Opt level: O3

ArrayRef<double> * __thiscall
mp::
SolutionChecker<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::RecomputeAuxVars(ArrayRef<double> *__return_storage_ptr__,
                  SolutionChecker<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                  *this,ArrayRef<double> *x,vector<bool,_std::allocator<bool>_> *is_final)

{
  pointer pdVar1;
  pointer pdVar2;
  int i;
  allocator_type local_2c9;
  vector<bool,_std::allocator<bool>_> local_2c8;
  double local_2a0;
  vector<double,_std::allocator<double>_> local_298;
  _Any_data local_280;
  code *local_270;
  VarVecRecomp local_260;
  ArrayRef<double> local_1f8;
  ArrayRef<double> local_1c8;
  ArrayRef<mp::var::Type> local_198;
  ArrayRef<double> local_168;
  VarInfoRecomp vir;
  
  local_2a0 = *(double *)((long)&this[7].recomp_fn.super__Function_base._M_functor + 8);
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_298,x->data_,x->data_ + x->size_,
             &local_2c9);
  std::function<double_(int,_const_mp::VarInfoRecomp_&)>::function
            ((function<double_(int,_const_mp::VarInfoRecomp_&)> *)&local_280,&this->recomp_fn);
  std::vector<bool,_std::allocator<bool>_>::vector(&local_2c8,is_final);
  VarVecRecomp::VarVecRecomp(&local_260,&local_298,(VarsRecomputeFn *)&local_280,&local_2c8);
  local_168.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168.data_ = (double *)0x0;
  local_168.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.size_ = 0;
  local_198.save_.super__Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.save_.super__Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.save_.super__Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198.data_ = (Type *)this[-0xe].recomp_fn.super__Function_base._M_manager;
  local_198.size_ = (long)this[-0xe].recomp_fn._M_invoker - (long)local_198.data_ >> 2;
  local_1c8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.data_ = (double *)this[-0x11].recomp_fn.super__Function_base._M_manager;
  local_1c8.size_ = (long)this[-0x11].recomp_fn._M_invoker - (long)local_1c8.data_ >> 3;
  local_1f8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8.data_ = *(double **)((long)&this[-0x10].recomp_fn.super__Function_base._M_functor + 8);
  local_1f8.size_ =
       (long)this[-0x10].recomp_fn.super__Function_base._M_manager - (long)local_1f8.data_ >> 3;
  VarInfoImpl<mp::VarVecRecomp>::VarInfoImpl
            (&vir.super_VarInfoRecompTypedef,local_2a0,true,&local_260,&local_168,&local_198,
             &local_1c8,&local_1f8,*(int *)&this[8].recomp_fn.super__Function_base._M_functor,
             *(int *)((long)&this[8].recomp_fn.super__Function_base._M_functor + 4));
  if (local_1f8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.save_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.save_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1c8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1c8.save_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.save_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_198.save_.super__Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.save_.
                    super__Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198.save_.
                          super__Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.save_.
                          super__Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_168.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_168.save_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.save_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_260.recomp_fn_.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_260.recomp_fn_.super__Function_base._M_manager)
              ((_Any_data *)&local_260.recomp_fn_,(_Any_data *)&local_260.recomp_fn_,
               __destroy_functor);
  }
  if (local_260.is_recomp_.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_260.is_recomp_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_260.is_recomp_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_260.is_recomp_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_260.is_recomp_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_260.is_recomp_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_offset = 0;
    local_260.is_recomp_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_260.is_recomp_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_260.is_recomp_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_260.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_260.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_260.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_260.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_270 != (code *)0x0) {
    (*local_270)(&local_280,&local_280,__destroy_functor);
  }
  if (local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  i = (int)((ulong)((long)vir.super_VarInfoRecompTypedef.x_.x_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)vir.super_VarInfoRecompTypedef.x_.x_.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3);
  vir.super_VarInfoRecompTypedef.x_.p_var_info_recomp_ =
       (VarInfoRecomp *)&vir.super_VarInfoRecompTypedef;
  while (pdVar2 = vir.super_VarInfoRecompTypedef.x_.x_.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish,
        pdVar1 = vir.super_VarInfoRecompTypedef.x_.x_.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start, i = i + -1, i != -1) {
    VarVecRecomp::operator[](&vir.super_VarInfoRecompTypedef.x_,i);
  }
  (__return_storage_ptr__->save_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       vir.super_VarInfoRecompTypedef.x_.x_.super__Vector_base<double,_std::allocator<double>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->save_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish =
       vir.super_VarInfoRecompTypedef.x_.x_.super__Vector_base<double,_std::allocator<double>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->save_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       vir.super_VarInfoRecompTypedef.x_.x_.super__Vector_base<double,_std::allocator<double>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  vir.super_VarInfoRecompTypedef.x_.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vir.super_VarInfoRecompTypedef.x_.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vir.super_VarInfoRecompTypedef.x_.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->data_ = pdVar1;
  __return_storage_ptr__->size_ = (long)pdVar2 - (long)pdVar1 >> 3;
  VarInfoImpl<mp::VarVecRecomp>::~VarInfoImpl(&vir.super_VarInfoRecompTypedef);
  return __return_storage_ptr__;
}

Assistant:

ArrayRef<double> RecomputeAuxVars(
      ArrayRef<double> x, std::vector<bool> is_final={}) {
    VarInfoRecomp vir {
      MPCD( sol_feas_tol() ),
          true,        // currently not relevant for recomputation
      {x, recomp_fn, is_final},
      {},              // no raw values
      MPCD( GetModel() ).var_type_vec(),
          MPCD( GetModel() ).var_lb_vec(),
          MPCD( GetModel() ).var_ub_vec(),
          MPCD( sol_round() ), MPCD( sol_prec() )
    };
    vir.get_x().set_p_var_info(&vir);
    for (auto i=vir.size(); i--; )
      vir[i];         // touch the variable to be recomputed
    return std::move(vir.get_x().get_x());
  }